

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O0

Maybe<capnp::Orphan<capnp::compiler::Declaration>_> * __thiscall
capnp::compiler::CapnpParser::parseStatement
          (Maybe<capnp::Orphan<capnp::compiler::Declaration>_> *__return_storage_ptr__,
          CapnpParser *this,Reader statement,DeclParser *parser)

{
  int *__return_storage_ptr___00;
  uint *__return_storage_ptr___01;
  ErrorReporter *pEVar1;
  Reader statement_00;
  uint uVar2;
  bool bVar3;
  Which WVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  NullableValue<capnp::compiler::CapnpParser::DeclParserResult> *other;
  DeclParserResult *pDVar8;
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
  *parser_00;
  NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> *other_00;
  Orphan<capnp::compiler::Declaration> *pOVar9;
  Reader *pRVar10;
  EndOfInput_ *in_RCX;
  Iterator IVar11;
  Iterator IVar12;
  Iterator IVar13;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  IVar14;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  end;
  StringPtr local_4b8;
  Reader *local_4a8;
  uint local_4a0;
  Reader *local_498;
  uint local_490;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_488;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_478;
  TemporaryPointer<capnp::compiler::Token::Reader> local_468;
  Reader *local_438;
  uint local_430;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_428;
  Reader *local_418;
  uint local_410;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_408;
  TemporaryPointer<capnp::compiler::Token::Reader> local_3f8;
  Reader *local_3c8;
  uint local_3c0;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_3b8;
  uint local_3a4;
  Reader *pRStack_3a0;
  uint32_t bestByte;
  uint local_398;
  undefined1 local_390 [8];
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  best;
  StringPtr local_378;
  Array<capnp::Orphan<capnp::compiler::Declaration>_> local_368;
  Orphan<capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>_> local_350;
  Orphan<capnp::compiler::Declaration> *local_330;
  Orphan<capnp::compiler::Declaration> *member;
  Maybe<capnp::Orphan<capnp::compiler::Declaration>_> local_2f0;
  undefined1 local_2c8 [8];
  NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> _member1064;
  Reader memberStatement;
  undefined1 local_260 [8];
  Iterator __end7;
  undefined1 local_240 [8];
  Iterator __begin7;
  Reader *__range7;
  Vector<capnp::Orphan<capnp::compiler::Declaration>_> members;
  Reader memberStatements;
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
  *memberParser;
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
  *_memberParser1060;
  size_t local_1c0;
  ArrayPtr<const_char> local_1b0;
  undefined1 local_1a0 [8];
  BuilderFor<capnp::compiler::Declaration> builder;
  DeclParserResult *output;
  Maybe<capnp::compiler::CapnpParser::DeclParserResult> local_160;
  undefined1 local_120 [8];
  NullableValue<capnp::compiler::CapnpParser::DeclParserResult> _output1041;
  undefined1 local_a0 [8];
  ParserInput parserInput;
  Reader tokens;
  Sequence_<const_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_const_kj::parse::EndOfInput__&>
  fullParser;
  DeclParser *parser_local;
  CapnpParser *this_local;
  
  __return_storage_ptr___00 = &tokens.reader.nestingLimit;
  kj::parse::
  sequence<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>const&,kj::parse::EndOfInput_const&>
            ((Sequence_<const_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_const_kj::parse::EndOfInput__&>
              *)__return_storage_ptr___00,(parse *)parser,
             (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
              *)&kj::parse::endOfInput,in_RCX);
  __return_storage_ptr___01 = &parserInput.best.index;
  Statement::Reader::getTokens((Reader *)__return_storage_ptr___01,&statement);
  IVar11 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::begin
                     ((Reader *)__return_storage_ptr___01);
  IVar12 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end
                     ((Reader *)__return_storage_ptr___01);
  _output1041.field_1._48_8_ = IVar12.container;
  IVar14._12_4_ = 0;
  IVar14.container = (Reader *)SUB128(IVar11._0_12_,0);
  IVar14.index = SUB124(IVar11._0_12_,8);
  end._12_4_ = 0;
  end.container = (Reader *)SUB128(IVar12._0_12_,0);
  end.index = SUB124(IVar12._0_12_,8);
  kj::parse::
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  ::IteratorInput((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                   *)local_a0,IVar14,end);
  kj::parse::
  Sequence_<const_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_const_kj::parse::EndOfInput__&>
  ::
  operator()<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>_>
            (&local_160,
             (Sequence_<const_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_const_kj::parse::EndOfInput__&>
              *)__return_storage_ptr___00,
             (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
              *)local_a0);
  other = kj::_::readMaybe<capnp::compiler::CapnpParser::DeclParserResult>(&local_160);
  kj::_::NullableValue<capnp::compiler::CapnpParser::DeclParserResult>::NullableValue
            ((NullableValue<capnp::compiler::CapnpParser::DeclParserResult> *)local_120,other);
  kj::Maybe<capnp::compiler::CapnpParser::DeclParserResult>::~Maybe(&local_160);
  pDVar8 = kj::_::NullableValue::operator_cast_to_DeclParserResult_((NullableValue *)local_120);
  if (pDVar8 == (DeclParserResult *)0x0) {
    IVar14 = kj::parse::
             IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
             ::getBest((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                        *)local_a0);
    pRStack_3a0 = IVar14.container;
    local_398 = IVar14.index;
    local_390 = (undefined1  [8])pRStack_3a0;
    best.container._0_4_ = local_398;
    IVar11 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end
                       ((Reader *)&parserInput.best.index);
    local_3c8 = IVar11.container;
    local_3c0 = IVar11.index;
    local_3b8.container = local_3c8;
    local_3b8.index = local_3c0;
    bVar3 = capnp::_::
            IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
            ::operator==((IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                          *)local_390,&local_3b8);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      IVar11 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end
                         ((Reader *)&parserInput.best.index);
      local_418 = IVar11.container;
      local_410 = IVar11.index;
      local_408.container = local_418;
      local_408.index = local_410;
      IVar11 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::begin
                         ((Reader *)&parserInput.best.index);
      local_438 = IVar11.container;
      local_430 = IVar11.index;
      local_428.container = local_438;
      local_428.index = local_430;
      bVar3 = capnp::_::
              IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
              ::operator==(&local_408,&local_428);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        local_3a4 = Statement::Reader::getStartByte(&statement);
      }
      else {
        IVar11 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end
                           ((Reader *)&parserInput.best.index);
        local_498 = IVar11.container;
        local_490 = IVar11.index;
        local_488.container = local_498;
        local_488.index = local_490;
        IVar14 = capnp::_::
                 IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                 ::operator-(&local_488,1);
        local_4a8 = IVar14.container;
        local_4a0 = IVar14.index;
        local_478.container = local_4a8;
        local_478.index = local_4a0;
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
        ::operator->(&local_468,&local_478);
        pRVar10 = capnp::_::TemporaryPointer<capnp::compiler::Token::Reader>::operator->(&local_468)
        ;
        local_3a4 = Token::Reader::getEndByte(pRVar10);
      }
    }
    else {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
      ::operator->(&local_3f8,
                   (IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                    *)local_390);
      pRVar10 = capnp::_::TemporaryPointer<capnp::compiler::Token::Reader>::operator->(&local_3f8);
      local_3a4 = Token::Reader::getStartByte(pRVar10);
    }
    uVar2 = local_3a4;
    pEVar1 = this->errorReporter;
    kj::StringPtr::StringPtr(&local_4b8,"Parse error.");
    (**pEVar1->_vptr_ErrorReporter)
              (pEVar1,(ulong)uVar2,(ulong)uVar2,local_4b8.content.ptr,local_4b8.content.size_);
    kj::Maybe<capnp::Orphan<capnp::compiler::Declaration>_>::Maybe(__return_storage_ptr__);
  }
  else {
    builder._builder._32_8_ =
         kj::_::NullableValue<capnp::compiler::CapnpParser::DeclParserResult>::operator*
                   ((NullableValue<capnp::compiler::CapnpParser::DeclParserResult> *)local_120);
    Orphan<capnp::compiler::Declaration>::get
              ((BuilderFor<capnp::compiler::Declaration> *)local_1a0,
               (Orphan<capnp::compiler::Declaration> *)builder._builder._32_8_);
    bVar3 = Statement::Reader::hasDocComment(&statement);
    if (bVar3) {
      local_1b0 = (ArrayPtr<const_char>)Statement::Reader::getDocComment(&statement);
      Declaration::Builder::setDocComment((Builder *)local_1a0,(Reader)local_1b0);
    }
    uVar5 = Statement::Reader::getStartByte(&statement);
    Declaration::Builder::setStartByte((Builder *)local_1a0,uVar5);
    uVar5 = Statement::Reader::getEndByte(&statement);
    Declaration::Builder::setEndByte((Builder *)local_1a0,uVar5);
    WVar4 = Statement::Reader::which(&statement);
    if (WVar4 == LINE) {
      bVar3 = kj::
              Maybe<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_>
              ::operator==((Maybe<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_>
                            *)(builder._builder._32_8_ + 0x20));
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        pEVar1 = this->errorReporter;
        uVar5 = Statement::Reader::getStartByte(&statement);
        uVar7 = Statement::Reader::getEndByte(&statement);
        kj::StringPtr::StringPtr
                  ((StringPtr *)&_memberParser1060,
                   "This statement should end with a block, not a semicolon.");
        (**pEVar1->_vptr_ErrorReporter)
                  (pEVar1,(ulong)uVar5,(ulong)uVar7,_memberParser1060,local_1c0);
      }
    }
    else if (WVar4 == BLOCK) {
      parser_00 = kj::_::
                  readMaybe<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>>
                            ((Maybe<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_>
                              *)(builder._builder._32_8_ + 0x20));
      if (parser_00 ==
          (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
           *)0x0) {
        pEVar1 = this->errorReporter;
        uVar5 = Statement::Reader::getStartByte(&statement);
        uVar7 = Statement::Reader::getEndByte(&statement);
        kj::StringPtr::StringPtr
                  (&local_378,"This statement should end with a semicolon, not a block.");
        (**pEVar1->_vptr_ErrorReporter)
                  (pEVar1,(ulong)uVar5,(ulong)uVar7,local_378.content.ptr,local_378.content.size_);
      }
      else {
        Statement::Reader::getBlock((Reader *)&members.builder.disposer,&statement);
        uVar6 = List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader::size
                          ((Reader *)&members.builder.disposer);
        kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::Vector
                  ((Vector<capnp::Orphan<capnp::compiler::Declaration>_> *)&__range7,(ulong)uVar6);
        __begin7._8_8_ = &members.builder.disposer;
        IVar13 = List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader::begin
                           ((Reader *)__begin7._8_8_);
        __end7._8_8_ = IVar13.container;
        __begin7.container._0_4_ = IVar13.index;
        local_240 = (undefined1  [8])__end7._8_8_;
        IVar13 = List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader::end
                           ((Reader *)__begin7._8_8_);
        local_260 = (undefined1  [8])IVar13.container;
        __end7.container._0_4_ = IVar13.index;
        while( true ) {
          bVar3 = capnp::_::
                  IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
                  ::operator==((IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
                                *)local_240,
                               (IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
                                *)local_260);
          if (((bVar3 ^ 0xffU) & 1) == 0) break;
          capnp::_::
          IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
          ::operator*((Reader *)&_member1064.field_1.value.builder.location,
                      (IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
                       *)local_240);
          member = (Orphan<capnp::compiler::Declaration> *)
                   _member1064.field_1.value.builder.location;
          statement_00._reader.capTable = (CapTableReader *)memberStatement._reader.segment;
          statement_00._reader.segment = (SegmentReader *)_member1064.field_1.value.builder.location
          ;
          statement_00._reader.data = memberStatement._reader.capTable;
          statement_00._reader.pointers = (WirePointer *)memberStatement._reader.data;
          statement_00._reader._32_8_ = memberStatement._reader.pointers;
          statement_00._reader._40_8_ = memberStatement._reader._32_8_;
          parseStatement(&local_2f0,this,statement_00,parser_00);
          other_00 = kj::_::readMaybe<capnp::Orphan<capnp::compiler::Declaration>>(&local_2f0);
          kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>::NullableValue
                    ((NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> *)local_2c8,
                     other_00);
          kj::Maybe<capnp::Orphan<capnp::compiler::Declaration>_>::~Maybe(&local_2f0);
          pOVar9 = kj::_::NullableValue::operator_cast_to_Orphan_((NullableValue *)local_2c8);
          if (pOVar9 != (Orphan<capnp::compiler::Declaration> *)0x0) {
            local_330 = kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>::
                        operator*((NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> *)
                                  local_2c8);
            pOVar9 = kj::mv<capnp::Orphan<capnp::compiler::Declaration>>(local_330);
            kj::Vector<capnp::Orphan<capnp::compiler::Declaration>>::
            add<capnp::Orphan<capnp::compiler::Declaration>>
                      ((Vector<capnp::Orphan<capnp::compiler::Declaration>> *)&__range7,pOVar9);
          }
          kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>::~NullableValue
                    ((NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> *)local_2c8);
          capnp::_::
          IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
          ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
                        *)local_240);
        }
        kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::releaseAsArray
                  (&local_368,(Vector<capnp::Orphan<capnp::compiler::Declaration>_> *)&__range7);
        anon_unknown_0::arrayToList<capnp::compiler::Declaration>
                  (&local_350,&this->orphanage,&local_368);
        Declaration::Builder::adoptNestedDecls((Builder *)local_1a0,&local_350);
        Orphan<capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>_>::~Orphan(&local_350);
        kj::Array<capnp::Orphan<capnp::compiler::Declaration>_>::~Array(&local_368);
        kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::~Vector
                  ((Vector<capnp::Orphan<capnp::compiler::Declaration>_> *)&__range7);
      }
    }
    pOVar9 = kj::mv<capnp::Orphan<capnp::compiler::Declaration>>
                       ((Orphan<capnp::compiler::Declaration> *)builder._builder._32_8_);
    kj::Maybe<capnp::Orphan<capnp::compiler::Declaration>_>::Maybe(__return_storage_ptr__,pOVar9);
  }
  best._12_4_ = 1;
  kj::_::NullableValue<capnp::compiler::CapnpParser::DeclParserResult>::~NullableValue
            ((NullableValue<capnp::compiler::CapnpParser::DeclParserResult> *)local_120);
  kj::parse::
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  ::~IteratorInput((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                    *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Orphan<Declaration>> CapnpParser::parseStatement(
    Statement::Reader statement, const DeclParser& parser) {
  auto fullParser = p::sequence(parser, p::endOfInput);

  auto tokens = statement.getTokens();
  ParserInput parserInput(tokens.begin(), tokens.end());

  KJ_IF_SOME(output, fullParser(parserInput)) {
    auto builder = output.decl.get();

    if (statement.hasDocComment()) {
      builder.setDocComment(statement.getDocComment());
    }

    builder.setStartByte(statement.getStartByte());
    builder.setEndByte(statement.getEndByte());

    switch (statement.which()) {
      case Statement::LINE:
        if (output.memberParser != kj::none) {
          errorReporter.addError(statement.getStartByte(), statement.getEndByte(),
              "This statement should end with a block, not a semicolon.");
        }
        break;

      case Statement::BLOCK:
        KJ_IF_SOME(memberParser, output.memberParser) {
          auto memberStatements = statement.getBlock();
          kj::Vector<Orphan<Declaration>> members(memberStatements.size());
          for (auto memberStatement: memberStatements) {
            KJ_IF_SOME(member, parseStatement(memberStatement, memberParser)) {
              members.add(kj::mv(member));
            }
          }
          builder.adoptNestedDecls(arrayToList(orphanage, members.releaseAsArray()));
        } else {
          errorReporter.addError(statement.getStartByte(), statement.getEndByte(),
              "This statement should end with a semicolon, not a block.");
        }
        break;
    }

    return kj::mv(output.decl);

  }